

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeclarationBinderTester_4000_4999.cpp
# Opt level: O0

void __thiscall psy::C::DeclarationBinderTester::case4017(DeclarationBinderTester *this)

{
  Expectation *pEVar1;
  Decl *pDVar2;
  socklen_t __len;
  allocator<char> local_389;
  string local_388;
  Decl local_368;
  Decl local_2a0;
  string local_1d8;
  Expectation local_1b8;
  Expectation local_100;
  allocator<char> local_31;
  string local_30 [32];
  DeclarationBinderTester *local_10;
  DeclarationBinderTester *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_30,"long double signed x ;",&local_31);
  Expectation::Expectation(&local_1b8);
  std::__cxx11::string::string
            ((string *)&local_1d8,
             (string *)&DeclarationBinder::DiagnosticsReporter::ID_of_InvalidType_abi_cxx11_);
  pEVar1 = Expectation::diagnostic(&local_1b8,Error,&local_1d8);
  Decl::Decl(&local_368);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_388,"x",&local_389);
  __len = 0;
  pDVar2 = Decl::Object(&local_368,&local_388,VariableDeclaration,File);
  pDVar2 = Ty::Basic(&pDVar2->ty_,LongDouble,None);
  Decl::Decl(&local_2a0,pDVar2);
  pEVar1 = Expectation::declaration(pEVar1,&local_2a0);
  Expectation::Expectation(&local_100,pEVar1);
  bind(this,(int)local_30,(sockaddr *)&local_100,__len);
  Expectation::~Expectation(&local_100);
  Decl::~Decl(&local_2a0);
  std::__cxx11::string::~string((string *)&local_388);
  std::allocator<char>::~allocator(&local_389);
  Decl::~Decl(&local_368);
  std::__cxx11::string::~string((string *)&local_1d8);
  Expectation::~Expectation(&local_1b8);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator(&local_31);
  return;
}

Assistant:

void DeclarationBinderTester::case4017()
{
    bind("long double signed x ;",
         Expectation()
         .diagnostic(
             Expectation::ErrorOrWarn::Error,
             DeclarationBinder::DiagnosticsReporter::ID_of_InvalidType)
         .declaration(Decl()
                      .Object("x", SymbolKind::VariableDeclaration)
                      .ty_.Basic(BasicTypeKind::LongDouble)));
}